

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxdraw.c
# Opt level: O2

wchar_t nh_box_wborder(WINDOW_conflict *win,attr_t attrs)

{
  wchar_t wVar1;
  ulong uVar2;
  undefined1 uVar3;
  wchar_t tmp_7 [2];
  cchar_t tl;
  cchar_t bs;
  cchar_t ts;
  cchar_t rs;
  cchar_t ls;
  cchar_t br;
  cchar_t bl;
  cchar_t tr;
  
  if (box_draw_mode == 1) {
    rs.attr = 0x2502;
    rs.chars[0] = L'\0';
    uVar3 = (undefined1)(attrs >> 8);
    setcchar(&ls,&rs,attrs,uVar3,0);
    ts.attr = box_chars[box_draw_mode][9];
    ts.chars[0] = L'\0';
    setcchar(&rs,&ts,attrs,uVar3,0);
    bs.attr = box_chars[box_draw_mode][8];
    bs.chars[0] = L'\0';
    setcchar(&ts,&bs,attrs,uVar3,0);
    tl.attr = box_chars[box_draw_mode][8];
    tl.chars[0] = L'\0';
    setcchar(&bs,&tl,attrs,uVar3,0);
    tr.attr = box_chars[box_draw_mode][0];
    tr.chars[0] = L'\0';
    setcchar(&tl,&tr,attrs,uVar3,0);
    bl.attr = box_chars[box_draw_mode][2];
    bl.chars[0] = L'\0';
    setcchar(&tr,&bl,attrs,uVar3,0);
    br.attr = box_chars[box_draw_mode][1];
    br.chars[0] = L'\0';
    setcchar(&bl,&br,attrs,uVar3,0);
    tmp_7[0] = box_chars[box_draw_mode][3];
    tmp_7[1] = L'\0';
    setcchar(&br,tmp_7,attrs,uVar3,0);
    wVar1 = wborder_set(win,&ls,&rs,&ts,&bs,&tl,&tr,&bl,&br);
  }
  else {
    wattr_on(win,attrs,0);
    uVar2 = (ulong)box_draw_mode;
    wVar1 = wborder(win,box_chars[uVar2][9],box_chars[uVar2][9],box_chars[uVar2][8],
                    box_chars[uVar2][8],box_chars[uVar2][0],box_chars[uVar2][2],box_chars[uVar2][1],
                    box_chars[uVar2][3]);
    wattr_off(win,attrs,0);
  }
  return wVar1;
}

Assistant:

int nh_box_wborder(WINDOW *win, attr_t attrs)
{
    if (box_draw_mode == 1) {
	cchar_t ls, rs, ts, bs, tl, tr, bl, br;
	NH_BOX_SETCCHAR(&ls, VLINE, attrs);
	NH_BOX_SETCCHAR(&rs, VLINE, attrs);
	NH_BOX_SETCCHAR(&ts, HLINE, attrs);
	NH_BOX_SETCCHAR(&bs, HLINE, attrs);
	NH_BOX_SETCCHAR(&tl, ULCORNER, attrs);
	NH_BOX_SETCCHAR(&tr, URCORNER, attrs);
	NH_BOX_SETCCHAR(&bl, LLCORNER, attrs);
	NH_BOX_SETCCHAR(&br, LRCORNER, attrs);
	return wborder_set(win, &ls, &rs, &ts, &bs, &tl, &tr, &bl, &br);

    } else {
	int r;
	wattron(win, attrs);
	r = wborder(win,
		      NH_BOX_CHAR(VLINE), NH_BOX_CHAR(VLINE),
		      NH_BOX_CHAR(HLINE), NH_BOX_CHAR(HLINE),
		      NH_BOX_CHAR(ULCORNER), NH_BOX_CHAR(URCORNER),
		      NH_BOX_CHAR(LLCORNER), NH_BOX_CHAR(LRCORNER));
	wattroff(win, attrs);
	return r;
    }
}